

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZukerAlgorithm.h
# Opt level: O3

int __thiscall
ZukerAlgorithm::interior_loop
          (ZukerAlgorithm *this,int i,int j,int h,int k,int i1,int j1,int h1,int k1,int n1,int n2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int (*paiVar4) [5];
  long lVar5;
  int (*paiVar6) [5];
  uint uVar7;
  int iVar8;
  int iVar9;
  
  iVar2 = *(int *)((long)(i + 1) * 0x14 + 0x1b14a4 + (long)j * 4);
  lVar5 = (long)iVar2;
  iVar9 = rtype[*(int *)((long)(h + 1) * 0x14 + 0x1b14a4 + (long)k * 4)];
  lVar3 = (long)iVar9;
  iVar8 = n1;
  iVar1 = n2;
  if (n2 < n1) {
    iVar8 = n2;
    iVar1 = n1;
  }
  if (iVar8 == 2) {
    if (iVar1 == 3) {
      paiVar6 = mismatch23I[lVar5] + (i1 + 1);
      paiVar4 = mismatch23I[lVar3] + (k1 + 1);
      iVar2 = ninio + internal_loop[5];
      goto LAB_00145e47;
    }
    if (iVar1 == 2) {
      return *(int *)((long)(h1 + 1) * 100 + (long)(i1 + 1) * 500 + lVar5 * 20000 + lVar3 * 0x9c4 +
                      (long)(k1 + 1) * 0x14 + 0x1c46e4 + (long)j1 * 4);
    }
  }
  else if (iVar8 == 1) {
    if (iVar1 == 2) {
      iVar1 = k1;
      iVar8 = iVar9;
      if (n1 == 1) {
        h1 = j1;
        iVar1 = i1;
        iVar8 = iVar2;
        iVar2 = iVar9;
        i1 = k1;
      }
      return *(int *)((long)(iVar1 + 1) * 100 + (long)iVar2 * 500 + (long)iVar8 * 4000 +
                      (long)(i1 + 1) * 0x14 + 0x1bc9e4 + (long)h1 * 4);
    }
    if (iVar1 == 1) {
      return *(int *)(lVar5 * 800 + lVar3 * 100 + (long)(i1 + 1) * 0x14 + 0x1bb0e4 + (long)j1 * 4);
    }
    if (iVar1 < 0x1e) {
      iVar9 = internal_loop[(int)(iVar1 + 1U)];
    }
    else {
      iVar9 = (int)(lxc * Log.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar1 + 1U]) + internal_loop[0x1e];
    }
    iVar2 = (iVar1 + -1) * ninio;
    if (MAX_NINIO <= iVar2) {
      iVar2 = MAX_NINIO;
    }
    paiVar6 = mismatch1nI[lVar5] + (i1 + 1);
    paiVar4 = mismatch1nI[lVar3] + (k1 + 1);
    iVar2 = iVar2 + iVar9;
    goto LAB_00145e47;
  }
  uVar7 = n2 + n1;
  if ((int)uVar7 < 0x1f) {
    iVar9 = internal_loop[(int)uVar7];
  }
  else {
    iVar9 = (int)(lxc * Log.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar7]) + internal_loop[0x1e];
  }
  iVar2 = (iVar1 - iVar8) * ninio;
  if (MAX_NINIO <= iVar2) {
    iVar2 = MAX_NINIO;
  }
  paiVar6 = mismatchI[lVar5] + (i1 + 1);
  paiVar4 = mismatchI[lVar3] + (k1 + 1);
  iVar2 = iVar2 + iVar9;
LAB_00145e47:
  return iVar2 + (*paiVar6)[(long)j1 + 1] + (*paiVar4)[(long)h1 + 1];
}

Assistant:

inline int ZukerAlgorithm::interior_loop(int i, int j, int h, int k, int i1, int j1, int h1, int k1, int n1, int n2) const {
    int energy;
    int type = BP_pair[i+1][j+1];
    int type2 = rtype[BP_pair[h+1][k+1]];
    int nl, ns;

    nl = max(n1, n2);
    ns = min(n1, n2);
    if (ns==1) {
        if (nl==1)                    /* 1x1 loop */
            return int11[type][type2][i1+1][j1+1];
        if (nl==2) {                  /* 2x1 loop */
            if (n1==1)
                energy = int21[type][type2][i1+1][k1+1][j1+1];
            else
                energy = int21[type2][type][k1+1][i1+1][h1+1];
            return energy;
        }
        else {  /* 1xn loop */
            energy = (nl+1<=MAXLOOP)?(internal_loop[nl+1]) : (internal_loop[30]+(int)(lxc*Log[nl+1]));
            energy += min(MAX_NINIO, (nl-ns)*ninio);
            energy += mismatch1nI[type][i1+1][j1+1] + mismatch1nI[type2][k1+1][h1+1];
            return energy;
        }
    }
    else if (ns==2) {
        if(nl==2)      {              /* 2x2 loop */
            return int22[type][type2][i1+1][h1+1][k1+1][j1+1];}
        else if (nl==3){              /* 2x3 loop */
            energy = internal_loop[5]+ninio;
            energy += mismatch23I[type][i1+1][j1+1] + mismatch23I[type2][k1+1][h1+1];
            return energy;
        }

    }
    { /* generic interior loop (no else here!)*/
        energy = (n1+n2<=MAXLOOP)?(internal_loop[n1+n2]) : (internal_loop[30]+(int)(lxc*Log[n1+n2]));
        energy += min(MAX_NINIO, (nl-ns)*ninio);

        energy += mismatchI[type][i1+1][j1+1] + mismatchI[type2][k1+1][h1+1];
    }
    return energy;
}